

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr GetMemberSetTypeName(ExpressionContext *ctx,TypeBase *type)

{
  char *__src;
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  size_t sVar4;
  char *pos;
  char *name;
  uint nameLength;
  TypeBase *type_local;
  ExpressionContext *ctx_local;
  char *__s;
  
  uVar1 = InplaceStr::length(&type->name);
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(uVar1 + 9));
  __s = (char *)CONCAT44(extraout_var,iVar2);
  __src = (type->name).begin;
  uVar3 = InplaceStr::length(&type->name);
  memcpy(__s,__src,(ulong)uVar3);
  uVar3 = InplaceStr::length(&type->name);
  strcpy(__s + uVar3," members");
  (__s + uVar3)[8] = '\0';
  sVar4 = strlen(__s);
  if (sVar4 + 1 == (ulong)(uVar1 + 9)) {
    InplaceStr::InplaceStr((InplaceStr *)&ctx_local,__s);
    return _ctx_local;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x15b,"InplaceStr GetMemberSetTypeName(ExpressionContext &, TypeBase *)");
}

Assistant:

InplaceStr GetMemberSetTypeName(ExpressionContext &ctx, TypeBase* type)
{
	unsigned nameLength = type->name.length() + unsigned(strlen(" members")) + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	memcpy(pos, type->name.begin, type->name.length());
	pos += type->name.length();

	strcpy(pos, " members");
	pos += strlen(" members");

	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}